

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  GLfloat GVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  int iVar12;
  GLFWmonitor *handle;
  GLFWvidmode *pGVar13;
  GLFWwindow *handle_00;
  float *pfVar14;
  float fVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  int width;
  double local_1ba0;
  double local_1b98;
  long local_1b90;
  float local_1b84;
  float local_1b80;
  int local_1b7c;
  float l1dif [4];
  thrd_t physics_thread;
  double local_1b50;
  float l1amb [4];
  float local_1b38;
  float local_1b34;
  undefined4 local_1b28;
  undefined4 local_1b24;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  float l2dif [4];
  float l2amb [4];
  float l2pos [4];
  float l1spec [4];
  float local_1ab8;
  undefined8 local_1ab4;
  undefined8 uStack_1aac;
  undefined4 local_1aa4;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 local_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  float l1pos [4];
  
  physics_thread = 0;
  iVar12 = glfwInit();
  if (iVar12 == 0) {
    fwrite("Failed to initialize GLFW\n",0x1a,1,_stderr);
  }
  else {
    handle = (GLFWmonitor *)0x0;
    while( true ) {
      while (iVar12 = getopt(argc,argv,"fh"), iVar12 == 0x66) {
        handle = glfwGetPrimaryMonitor();
      }
      if (iVar12 == -1) break;
      if (iVar12 == 0x68) {
        usage();
LAB_00115ca5:
        exit(0);
      }
    }
    if (handle == (GLFWmonitor *)0x0) {
      width = 0x280;
      local_1b7c = 0x1e0;
    }
    else {
      pGVar13 = glfwGetVideoMode(handle);
      glfwWindowHint(0x21001,pGVar13->redBits);
      glfwWindowHint(0x21002,pGVar13->greenBits);
      glfwWindowHint(0x21003,pGVar13->blueBits);
      glfwWindowHint(0x2100f,pGVar13->refreshRate);
      width = pGVar13->width;
      local_1b7c = pGVar13->height;
    }
    handle_00 = glfwCreateWindow(width,local_1b7c,"Particle Engine",handle,(GLFWwindow *)0x0);
    if (handle_00 == (GLFWwindow *)0x0) {
      fwrite("Failed to create GLFW window\n",0x1d,1,_stderr);
    }
    else {
      if (handle != (GLFWmonitor *)0x0) {
        glfwSetInputMode(handle_00,0x33001,0x34003);
      }
      glfwMakeContextCurrent(handle_00);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSwapInterval(1);
      glfwSetFramebufferSizeCallback(handle_00,resize_callback);
      glfwSetKeyCallback(handle_00,key_callback);
      glfwGetFramebufferSize(handle_00,&width,&local_1b7c);
      iVar11 = local_1b7c;
      iVar12 = width;
      (*glad_glViewport)(0,0,width,local_1b7c);
      if (iVar11 == 0) {
        aspect_ratio = 1.0;
      }
      else {
        aspect_ratio = (float)iVar12 / (float)iVar11;
      }
      (*glad_glGenTextures)(1,&particle_tex_id);
      (*glad_glBindTexture)(0xde1,particle_tex_id);
      (*glad_glPixelStorei)(0xcf5,1);
      (*glad_glTexParameteri)(0xde1,0x2802,0x2900);
      (*glad_glTexParameteri)(0xde1,0x2803,0x2900);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
      (*glad_glTexImage2D)(0xde1,0,0x1909,8,8,0,0x1909,0x1401,"");
      (*glad_glGenTextures)(1,&floor_tex_id);
      (*glad_glBindTexture)(0xde1,floor_tex_id);
      (*glad_glPixelStorei)(0xcf5,1);
      (*glad_glTexParameteri)(0xde1,0x2802,0x2901);
      (*glad_glTexParameteri)(0xde1,0x2803,0x2901);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
      (*glad_glTexImage2D)(0xde1,0,0x1909,0x10,0x10,0,0x1909,0x1401,floor_texture);
      iVar12 = glfwExtensionSupported("GL_EXT_separate_specular_color");
      if (iVar12 != 0) {
        (*glad_glLightModeli)(0x81f8,0x81fa);
      }
      (*glad_glPolygonMode)(0x408,0x1b02);
      wireframe = 0;
      thread_sync.t = 0.0;
      thread_sync.dt = 0.001;
      thread_sync.p_frame = 0;
      thread_sync.d_frame = 0;
      mtx_init(&thread_sync.particles_lock,2);
      cnd_init(&thread_sync.p_done);
      cnd_init(&thread_sync.d_done);
      iVar12 = thrd_create(&physics_thread,physics_thread_main,handle_00);
      if (iVar12 == 1) {
        glfwSetTime(0.0);
        iVar12 = glfwWindowShouldClose(handle_00);
        while (iVar12 == 0) {
          local_1ba0 = glfwGetTime();
          local_1b50 = local_1ba0 - draw_scene_t_old;
          local_1ab8 = 1.5696855 / aspect_ratio;
          local_1ab4 = 0;
          uStack_1aac = 0;
          local_1aa4 = 0x3fc8eb74;
          local_1aa0 = 0;
          uStack_1a98 = 0;
          local_1a90 = 0xbf800000bf8456c8;
          uStack_1a88 = 0;
          local_1a80 = 0xc0022b64;
          draw_scene_t_old = local_1ba0;
          (*glad_glClearColor)(0.1,0.1,0.1,1.0);
          (*glad_glClear)(0x4100);
          (*glad_glMatrixMode)(0x1701);
          (*glad_glLoadMatrixf)(&local_1ab8);
          (*glad_glMatrixMode)(0x1700);
          (*glad_glLoadIdentity)();
          dVar6 = sin(local_1ba0 * 0.3);
          dVar7 = local_1ba0 * 10.0;
          (*glad_glRotated)(-80.0,1.0,0.0,0.0);
          (*glad_glRotated)(dVar6 * -10.0,0.0,1.0,0.0);
          (*glad_glRotated)(-dVar7,0.0,0.0,1.0);
          dVar7 = dVar7 * 0.017453292519943295;
          dVar6 = sin(dVar7);
          dVar8 = sin(local_1ba0 * 0.054105206811824215);
          dVar7 = cos(dVar7);
          dVar9 = cos(local_1ba0 * 0.05061454830783556);
          dVar10 = cos(local_1ba0 * 0.08552113334772216);
          (*glad_glTranslated)
                    (-(dVar8 + dVar8 + dVar6 * 15.0),-(dVar7 * -15.0 + dVar9 + dVar9),
                     -(dVar10 + dVar10 + 4.0));
          (*glad_glFrontFace)(0x901);
          (*glad_glCullFace)(0x405);
          (*glad_glEnable)(0xb44);
          l1pos[0] = 0.0;
          l1pos[1] = -9.0;
          l1pos[2] = 8.0;
          l1pos[3] = 1.0;
          l1amb[0] = 0.2;
          l1amb[1] = 0.2;
          l1amb[2] = 0.2;
          l1amb[3] = 1.0;
          l1dif[0] = 0.8;
          l1dif[1] = 0.4;
          l1dif[2] = 0.2;
          l1dif[3] = 1.0;
          l1spec[0] = 1.0;
          l1spec[1] = 0.6;
          l1spec[2] = 0.2;
          l1spec[3] = 0.0;
          l2pos[0] = -15.0;
          l2pos[1] = 12.0;
          l2pos[2] = 1.5;
          l2pos[3] = 1.0;
          l2amb[0] = 0.0;
          l2amb[1] = 0.0;
          l2amb[2] = 0.0;
          l2amb[3] = 1.0;
          l2dif[0] = 0.2;
          l2dif[1] = 0.4;
          l2dif[2] = 0.8;
          l2dif[3] = 1.0;
          local_1b08 = 0x3f19999a3e4ccccd;
          uStack_1b00 = 0x3f800000;
          (*glad_glLightfv)(0x4001,0x1203,l1pos);
          (*glad_glLightfv)(0x4001,0x1200,l1amb);
          (*glad_glLightfv)(0x4001,0x1201,l1dif);
          (*glad_glLightfv)(0x4001,0x1202,l1spec);
          (*glad_glLightfv)(0x4002,0x1203,l2pos);
          (*glad_glLightfv)(0x4002,0x1200,l2amb);
          (*glad_glLightfv)(0x4002,0x1201,l2dif);
          (*glad_glLightfv)(0x4002,0x1202,(GLfloat *)&local_1b08);
          (*glad_glLightfv)(0x4003,0x1203,glow_pos);
          (*glad_glLightfv)(0x4003,0x1201,glow_color);
          (*glad_glLightfv)(0x4003,0x1202,glow_color);
          (*glad_glEnable)(0x4001);
          (*glad_glEnable)(0x4002);
          (*glad_glEnable)(0x4003);
          (*glad_glEnable)(0xb50);
          (*glad_glEnable)(0xb60);
          (*glad_glFogi)(0xb65,0x800);
          (*glad_glFogf)(0xb62,0.05);
          (*glad_glFogfv)(0xb66,fog_color);
          if (wireframe == 0) {
            (*glad_glEnable)(0xde1);
            (*glad_glBindTexture)(0xde1,floor_tex_id);
          }
          if (draw_floor_floor_list == 0) {
            draw_floor_floor_list = (*glad_glGenLists)(1);
            (*glad_glNewList)(draw_floor_floor_list,0x1301);
            (*glad_glMaterialfv)(0x404,0x1201,floor_diffuse);
            (*glad_glMaterialfv)(0x404,0x1202,floor_specular);
            (*glad_glMaterialf)(0x404,0x1601,18.0);
            (*glad_glNormal3f)(0.0,0.0,1.0);
            (*glad_glBegin)(7);
            tessellate_floor(-1.0,-1.0,0.0,0.0,0);
            tessellate_floor(0.0,-1.0,1.0,0.0,0);
            tessellate_floor(0.0,0.0,1.0,1.0,0);
            tessellate_floor(-1.0,0.0,0.0,1.0,0);
            (*glad_glEnd)();
            (*glad_glEndList)();
          }
          else {
            (*glad_glCallList)(draw_floor_floor_list);
          }
          (*glad_glDisable)(0xde1);
          (*glad_glEnable)(0xb71);
          (*glad_glDepthFunc)(0x203);
          (*glad_glDepthMask)('\x01');
          if (draw_fountain_fountain_list == 0) {
            draw_fountain_fountain_list = (*glad_glGenLists)(1);
            (*glad_glNewList)(draw_fountain_fountain_list,0x1301);
            (*glad_glMaterialfv)(0x404,0x1201,fountain_diffuse);
            (*glad_glMaterialfv)(0x404,0x1202,fountain_specular);
            (*glad_glMaterialf)(0x404,0x1601,12.0);
            lVar16 = 0;
            do {
              (*glad_glBegin)(5);
              fVar18 = fountain_normal[lVar16 * 2 + 2];
              GVar2 = fountain_normal[lVar16 * 2 + 3];
              lVar1 = lVar16 * 2 + 1;
              dVar6 = 0.0;
              iVar12 = 0x21;
              local_1b90 = lVar16;
              do {
                local_1b98 = dVar6;
                dVar7 = cos(dVar6 * 0.19634954084936207);
                fVar20 = (float)dVar7;
                dVar6 = sin(dVar6 * 0.19634954084936207);
                fVar21 = (float)dVar6;
                (*glad_glNormal3f)(fVar18 * fVar20,fVar18 * fVar21,GVar2);
                fVar19 = fountain_side[lVar16 * 2];
                (*glad_glVertex3f)(fountain_side[lVar16 * 2 + 2] * fVar20,
                                   fountain_side[lVar16 * 2 + 2] * fVar21,
                                   fountain_side[lVar16 * 2 + 3]);
                (*glad_glNormal3f)(fountain_normal[lVar16 * 2] * fVar20,
                                   fountain_normal[lVar16 * 2] * fVar21,fountain_normal[lVar1]);
                (*glad_glVertex3f)(fVar20 * fVar19,fVar19 * fVar21,fountain_side[lVar1]);
                dVar6 = local_1b98 + 1.0;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
              (*glad_glEnd)();
              lVar16 = local_1b90 + 1;
            } while (lVar16 != 0xd);
            (*glad_glEndList)();
          }
          else {
            (*glad_glCallList)(draw_fountain_fountain_list);
          }
          (*glad_glDisable)(0xb50);
          (*glad_glDisable)(0xb60);
          (*glad_glGetFloatv)(0xba6,l1amb);
          fVar18 = l1amb[0];
          local_1b84 = l1amb[1];
          local_1b80 = local_1b34;
          local_1b98 = (double)CONCAT44(local_1b98._4_4_,local_1b28);
          local_1b90 = CONCAT44(local_1b90._4_4_,local_1b24);
          (*glad_glDepthMask)('\0');
          (*glad_glEnable)(0xbe2);
          (*glad_glBlendFunc)(0x302,1);
          if (wireframe == 0) {
            (*glad_glEnable)(0xde1);
            (*glad_glBindTexture)(0xde1,particle_tex_id);
          }
          (*glad_glInterleavedArrays)(0x2a29,0,l1pos);
          mtx_lock(&thread_sync.particles_lock);
          iVar12 = glfwWindowShouldClose(handle_00);
          if (iVar12 == 0) {
            if (thread_sync.p_frame <= thread_sync.d_frame) {
              do {
                clock_gettime(0,(timespec *)l1dif);
                lVar16 = (l1dif._8_8_ + 100000000) / 1000000000;
                l1dif._0_8_ = l1dif._0_8_ + lVar16;
                l1dif._8_8_ = lVar16 * -1000000000 + l1dif._8_8_ + 100000000;
                cnd_timedwait(&thread_sync.p_done,&thread_sync.particles_lock,(timespec *)l1dif);
                iVar12 = glfwWindowShouldClose(handle_00);
                if (iVar12 != 0) break;
              } while (thread_sync.p_frame <= thread_sync.d_frame);
            }
          }
          fVar19 = (fVar18 + local_1b84) * -0.35;
          fVar21 = (local_1b38 + local_1b80) * -0.35;
          fVar22 = (local_1b98._0_4_ + (float)local_1b90) * -0.35;
          fVar18 = (fVar18 - local_1b84) * 0.35;
          fVar20 = (local_1b38 - local_1b80) * 0.35;
          local_1b98 = (double)CONCAT44(local_1b98._4_4_,
                                        (local_1b98._0_4_ - (float)local_1b90) * 0.35);
          thread_sync.t = local_1ba0;
          thread_sync.dt = (float)local_1b50;
          thread_sync.d_frame = thread_sync.d_frame + 1;
          iVar12 = 0;
          lVar16 = 0x28;
          pfVar14 = l1pos;
          do {
            if (*(int *)((long)&particles[0].x + lVar16) != 0) {
              fVar17 = *(float *)(lVar16 + 0x15637c) * 4.0;
              fVar3 = *(float *)((long)&aspect_ratio + lVar16);
              fVar4 = *(float *)(lVar16 + 0x156374);
              fVar5 = *(float *)(lVar16 + 0x156378);
              fVar15 = 1.0;
              if (fVar17 <= 1.0) {
                fVar15 = fVar17;
              }
              pfVar14[0] = 0.0;
              pfVar14[1] = 0.0;
              fVar15 = (float)((int)(fVar3 * 255.0) & 0xffU |
                              ((int)(fVar4 * 255.0) & 0xffU) << 8 |
                              ((int)(fVar5 * 255.0) & 0xffU) << 0x10 | (int)(fVar15 * 255.0) << 0x18
                              );
              pfVar14[2] = fVar15;
              fVar3 = *(float *)((long)&thread_sync.particles_lock + lVar16 + 0x10);
              pfVar14[3] = fVar19 + fVar3;
              fVar4 = *(float *)((long)&thread_sync.particles_lock + lVar16 + 0x14);
              pfVar14[4] = fVar21 + fVar4;
              fVar5 = *(float *)((long)&thread_sync.particles_lock + lVar16 + 0x18);
              pfVar14[5] = fVar22 + fVar5;
              pfVar14[6] = 1.0;
              pfVar14[7] = 0.0;
              pfVar14[8] = fVar15;
              pfVar14[9] = fVar18 + fVar3;
              pfVar14[10] = fVar20 + fVar4;
              pfVar14[0xb] = local_1b98._0_4_ + fVar5;
              pfVar14[0xc] = 1.0;
              pfVar14[0xd] = 1.0;
              pfVar14[0xe] = fVar15;
              pfVar14[0xf] = fVar3 - fVar19;
              pfVar14[0x10] = fVar4 - fVar21;
              pfVar14[0x11] = fVar5 - fVar22;
              pfVar14[0x12] = 0.0;
              pfVar14[0x13] = 1.0;
              pfVar14[0x14] = fVar15;
              pfVar14[0x15] = fVar3 - fVar18;
              pfVar14[0x16] = fVar4 - fVar20;
              pfVar14[0x17] = fVar5 - local_1b98._0_4_;
              pfVar14 = pfVar14 + 0x18;
              iVar12 = iVar12 + 1;
            }
            if (0x45 < iVar12) {
              (*glad_glDrawArrays)(7,0,iVar12 << 2);
              pfVar14 = l1pos;
              iVar12 = 0;
            }
            lVar16 = lVar16 + 0x2c;
          } while ((int)lVar16 != 0x203c8);
          mtx_unlock(&thread_sync.particles_lock);
          cnd_signal(&thread_sync.d_done);
          (*glad_glDrawArrays)(7,0,iVar12 << 2);
          (*glad_glDisableClientState)(0x8074);
          (*glad_glDisableClientState)(0x8078);
          (*glad_glDisableClientState)(0x8076);
          (*glad_glDisable)(0xde1);
          (*glad_glDisable)(0xbe2);
          (*glad_glDepthMask)('\x01');
          (*glad_glDisable)(0xb71);
          glfwSwapBuffers(handle_00);
          glfwPollEvents();
          iVar12 = glfwWindowShouldClose(handle_00);
        }
        thrd_join(physics_thread,(int *)0x0);
        glfwDestroyWindow(handle_00);
        glfwTerminate();
        goto LAB_00115ca5;
      }
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, width, height;
    thrd_t physics_thread = 0;
    GLFWwindow* window;
    GLFWmonitor* monitor = NULL;

    if (!glfwInit())
    {
        fprintf(stderr, "Failed to initialize GLFW\n");
        exit(EXIT_FAILURE);
    }

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'f':
                monitor = glfwGetPrimaryMonitor();
                break;
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
        }
    }

    if (monitor)
    {
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);
        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);

        width  = mode->width;
        height = mode->height;
    }
    else
    {
        width  = 640;
        height = 480;
    }

    window = glfwCreateWindow(width, height, "Particle Engine", monitor, NULL);
    if (!window)
    {
        fprintf(stderr, "Failed to create GLFW window\n");
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    if (monitor)
        glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    glfwSetFramebufferSizeCallback(window, resize_callback);
    glfwSetKeyCallback(window, key_callback);

    // Set initial aspect ratio
    glfwGetFramebufferSize(window, &width, &height);
    resize_callback(window, width, height);

    // Upload particle texture
    glGenTextures(1, &particle_tex_id);
    glBindTexture(GL_TEXTURE_2D, particle_tex_id);
    glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_LUMINANCE, P_TEX_WIDTH, P_TEX_HEIGHT,
                 0, GL_LUMINANCE, GL_UNSIGNED_BYTE, particle_texture);

    // Upload floor texture
    glGenTextures(1, &floor_tex_id);
    glBindTexture(GL_TEXTURE_2D, floor_tex_id);
    glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_LUMINANCE, F_TEX_WIDTH, F_TEX_HEIGHT,
                 0, GL_LUMINANCE, GL_UNSIGNED_BYTE, floor_texture);

    if (glfwExtensionSupported("GL_EXT_separate_specular_color"))
    {
        glLightModeli(GL_LIGHT_MODEL_COLOR_CONTROL_EXT,
                      GL_SEPARATE_SPECULAR_COLOR_EXT);
    }

    // Set filled polygon mode as default (not wireframe)
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
    wireframe = 0;

    // Set initial times
    thread_sync.t  = 0.0;
    thread_sync.dt = 0.001f;
    thread_sync.p_frame = 0;
    thread_sync.d_frame = 0;

    mtx_init(&thread_sync.particles_lock, mtx_timed);
    cnd_init(&thread_sync.p_done);
    cnd_init(&thread_sync.d_done);

    if (thrd_create(&physics_thread, physics_thread_main, window) != thrd_success)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetTime(0.0);

    while (!glfwWindowShouldClose(window))
    {
        draw_scene(window, glfwGetTime());

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    thrd_join(physics_thread, NULL);

    glfwDestroyWindow(window);
    glfwTerminate();

    exit(EXIT_SUCCESS);
}